

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sstring_view.cpp
# Opt level: O3

void __thiscall
SStringViewRelational_Gt_Test<const_(anonymous_namespace)::sstringview_maker>::
~SStringViewRelational_Gt_Test
          (SStringViewRelational_Gt_Test<const_(anonymous_namespace)::sstringview_maker> *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TYPED_TEST (SStringViewRelational, Gt) {
#define GT(lhs, rhs, x, y)                                                                         \
    do {                                                                                           \
        auto const lhs_view = pstore::make_sstring_view ((lhs), std::strlen (lhs));                \
        EXPECT_EQ (lhs_view > (rhs), (x));                                                         \
        EXPECT_EQ ((rhs) > lhs_view, (y));                                                         \
    } while (0)
    GT ("", TypeParam (""), false, false);
    GT ("", TypeParam ("abcde"), false, true);
    GT ("", TypeParam ("abcdefghij"), false, true);
    GT ("", TypeParam ("abcdefghijklmnopqrst"), false, true);
    GT ("abcde", TypeParam (""), true, false);
    GT ("abcde", TypeParam ("abcde"), false, false);
    GT ("abcde", TypeParam ("abcdefghij"), false, true);
    GT ("abcde", TypeParam ("abcdefghijklmnopqrst"), false, true);
    GT ("abcdefghij", TypeParam (""), true, false);
    GT ("abcdefghij", TypeParam ("abcde"), true, false);
    GT ("abcdefghij", TypeParam ("abcdefghij"), false, false);
    GT ("abcdefghij", TypeParam ("abcdefghijklmnopqrst"), false, true);
    GT ("abcdefghijklmnopqrst", TypeParam (""), true, false);
    GT ("abcdefghijklmnopqrst", TypeParam ("abcde"), true, false);
    GT ("abcdefghijklmnopqrst", TypeParam ("abcdefghij"), true, false);
    GT ("abcdefghijklmnopqrst", TypeParam ("abcdefghijklmnopqrst"), false, false);
#undef GT
}